

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopDescriptor::RemoveLoop(LoopDescriptor *this,Loop *loop)

{
  uint32_t block_id;
  pointer ppLVar1;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  _Var2;
  Loop *pLVar3;
  pointer ppLVar4;
  __node_base *p_Var5;
  Loop *local_30;
  
  pLVar3 = &this->placeholder_top_loop_;
  if (loop->parent_ != (Loop *)0x0) {
    pLVar3 = loop->parent_;
  }
  local_30 = loop;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                    ((pLVar3->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pLVar3->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_30);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::erase
            (&pLVar3->nested_loops_,(const_iterator)_Var2._M_current);
  ppLVar1 = (local_30->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar4 = (local_30->nested_loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppLVar4 != ppLVar1; ppLVar4 = ppLVar4 + 1
      ) {
    (*ppLVar4)->parent_ = local_30->parent_;
  }
  std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
  insert<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,void>
            ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
             &pLVar3->nested_loops_,
             (const_iterator)
             (pLVar3->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              )(local_30->nested_loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              )(local_30->nested_loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  p_Var5 = &(local_30->loop_basic_blocks_)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    block_id = (uint32_t)*(size_type *)(p_Var5 + 1);
    pLVar3 = FindLoopForBasicBlock(this,block_id);
    if (pLVar3 == local_30) {
      SetBasicBlockToLoop(this,block_id,pLVar3->parent_);
    }
    else {
      ForgetBasicBlock(this,block_id);
    }
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                    ((this->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_30);
  pLVar3 = local_30;
  if (_Var2._M_current !=
      (this->loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_30 != (Loop *)0x0) {
      Loop::~Loop(local_30);
    }
    operator_delete(pLVar3,0x90);
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::erase
              (&this->loops_,(const_iterator)_Var2._M_current);
    return;
  }
  __assert_fail("it != loops_.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x3fa,"void spvtools::opt::LoopDescriptor::RemoveLoop(Loop *)");
}

Assistant:

void LoopDescriptor::RemoveLoop(Loop* loop) {
  Loop* parent = loop->GetParent() ? loop->GetParent() : &placeholder_top_loop_;
  parent->nested_loops_.erase(std::find(parent->nested_loops_.begin(),
                                        parent->nested_loops_.end(), loop));
  std::for_each(
      loop->nested_loops_.begin(), loop->nested_loops_.end(),
      [loop](Loop* sub_loop) { sub_loop->SetParent(loop->GetParent()); });
  parent->nested_loops_.insert(parent->nested_loops_.end(),
                               loop->nested_loops_.begin(),
                               loop->nested_loops_.end());
  for (uint32_t bb_id : loop->GetBlocks()) {
    Loop* l = FindLoopForBasicBlock(bb_id);
    if (l == loop) {
      SetBasicBlockToLoop(bb_id, l->GetParent());
    } else {
      ForgetBasicBlock(bb_id);
    }
  }

  LoopContainerType::iterator it =
      std::find(loops_.begin(), loops_.end(), loop);
  assert(it != loops_.end());
  delete loop;
  loops_.erase(it);
}